

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footprinttobin.cpp
# Opt level: O1

void __thiscall FootprintToBin::ReadFootprintFileNoChecks(FootprintToBin *this)

{
  Validate *__s;
  int iVar1;
  uint in_EAX;
  int iVar2;
  char *pcVar3;
  OASIS_FLOAT totalProbability;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  ValidateFootprint::ReadFirstFootprintLine
            (&this->super_ValidateFootprint,(OASIS_FLOAT *)((long)&uStack_28 + 4));
  (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[1])(this);
  __s = &(this->super_ValidateFootprint).super_Validate;
  pcVar3 = fgets(__s->line_,0x1000,_stdin);
  while (pcVar3 != (char *)0x0) {
    iVar2 = ValidateFootprint::ScanLine(&this->super_ValidateFootprint);
    if (iVar2 == 4) {
      iVar2 = (this->super_ValidateFootprint).prevEventID_;
      iVar1 = (int)(this->super_ValidateFootprint).initialEveID_;
      (this->super_ValidateFootprint).fr_.event_id = iVar1;
      (this->super_ValidateFootprint).fr_.super_EventRow.areaperil_id =
           (AREAPERIL_INT)(this->super_ValidateFootprint).initialAreaperilID_;
      if (iVar2 != iVar1) {
        (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[2])(this);
        (**(this->super_ValidateFootprint)._vptr_ValidateFootprint)(this);
      }
      (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[1])(this);
    }
    else {
      ReadFootprintFileNoChecks();
    }
    pcVar3 = fgets(__s->line_,0x1000,_stdin);
  }
  (*(this->super_ValidateFootprint)._vptr_ValidateFootprint[2])(this);
  return;
}

Assistant:

void FootprintToBin::ReadFootprintFileNoChecks() {
/* If user is satisfied that the footprint csv file is sound and therefore does
 * not require any validation checks, this method can be executed instead of
 * ValidateFootprint::ReadFootprintFile(). This method assumes that the methods
 * Validate:SkipHeaderRow() and WriteHeader() have been executed beforehand. */

  ReadFirstFootprintLine();
  WriteBinFootprintFile();

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      fr_.event_id = (int)initialEveID_;
#ifdef AREAPERIL_TYPE_UNSIGNED_LONG_LONG
      fr_.areaperil_id = initialAreaperilID_;
#else
      fr_.areaperil_id = (unsigned int)initialAreaperilID_;
#endif

      if (fr_.event_id != prevEventID_) {

        WriteIdxFootprintFile();
	SetPreviousEventID();

      }

      WriteBinFootprintFile();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  WriteIdxFootprintFile();

}